

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_cxxx_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint imm8;
  uint local_24;
  int disp8;
  uint imm_val;
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  imm8 = quads[1] << 4 | *quads;
  local_24 = quads[1] << 4 | *quads;
  if ((local_24 & 0x80) != 0) {
    local_24 = local_24 | 0xffffff00;
  }
  switch(quads[2]) {
  case 0:
    sh4asm_txt_movb_r0_a_disp8_gbr(em,imm8);
    break;
  case 1:
    sh4asm_txt_movw_r0_a_disp8_gbr(em,imm8 << 1);
    break;
  case 2:
    sh4asm_txt_movl_r0_a_disp8_gbr(em,imm8 << 2);
    break;
  case 3:
    sh4asm_txt_trapa_imm8(em,imm8);
    break;
  case 4:
    sh4asm_txt_movb_a_disp8_gbr_r0(em,imm8);
    break;
  case 5:
    sh4asm_txt_movw_a_disp8_gbr_r0(em,imm8 << 1);
    break;
  case 6:
    sh4asm_txt_movl_a_disp8_gbr_r0(em,imm8 << 2);
    break;
  case 7:
    sh4asm_txt_mova_a_disp8_pc_r0(em,local_24 * 4 + 4,pc);
    break;
  case 8:
    sh4asm_txt_tst_imm8_r0(em,imm8);
    break;
  case 9:
    sh4asm_txt_and_imm8_r0(em,imm8);
    break;
  case 10:
    sh4asm_txt_xor_imm8_r0(em,imm8);
    break;
  case 0xb:
    sh4asm_txt_or_imm8_r0(em,imm8);
    break;
  case 0xc:
    sh4asm_txt_tstb_imm8_a_r0_gbr(em,imm8);
    break;
  case 0xd:
    sh4asm_txt_andb_imm8_a_r0_gbr(em,imm8);
    break;
  case 0xe:
    sh4asm_txt_xorb_imm8_a_r0_gbr(em,imm8);
    break;
  case 0xf:
    sh4asm_txt_orb_imm8_a_r0_gbr(em,imm8);
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_cxxx_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    // mask is 0xff00
    unsigned imm_val = (quads[1] << 4) | quads[0];
    int disp8 = (quads[1] << 4) | quads[0];
    if (disp8 & (1 << 7))
        disp8 |= ~SH4ASM_BIT_RANGE(0, 7);
    switch (quads[2]) {
    case 0:
        sh4asm_txt_movb_r0_a_disp8_gbr(em, imm_val);
        break;
    case 1:
        sh4asm_txt_movw_r0_a_disp8_gbr(em, imm_val << 1);
        break;
    case 2:
        sh4asm_txt_movl_r0_a_disp8_gbr(em, imm_val << 2);
        break;
    case 3:
        sh4asm_txt_trapa_imm8(em, imm_val);
        break;
    case 4:
        sh4asm_txt_movb_a_disp8_gbr_r0(em, imm_val);
        break;
    case 5:
        sh4asm_txt_movw_a_disp8_gbr_r0(em, imm_val << 1);
        break;
    case 6:
        sh4asm_txt_movl_a_disp8_gbr_r0(em, imm_val << 2);
        break;
    case 7:
        sh4asm_txt_mova_a_disp8_pc_r0(em, 4 * disp8 + 4, pc);
        break;
    case 8:
        sh4asm_txt_tst_imm8_r0(em, imm_val);
        break;
    case 9:
        sh4asm_txt_and_imm8_r0(em, imm_val);
        break;
    case 10:
        sh4asm_txt_xor_imm8_r0(em, imm_val);
        break;
    case 11:
        sh4asm_txt_or_imm8_r0(em, imm_val);
        break;
    case 12:
        sh4asm_txt_tstb_imm8_a_r0_gbr(em, imm_val);
        break;
    case 13:
        sh4asm_txt_andb_imm8_a_r0_gbr(em, imm_val);
        break;
    case 14:
        sh4asm_txt_xorb_imm8_a_r0_gbr(em, imm_val);
        break;
    case 15:
        sh4asm_txt_orb_imm8_a_r0_gbr(em, imm_val);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}